

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O0

void __thiscall Dialog::on_mouse_button_down(Dialog *this,ALLEGRO_MOUSE_EVENT *event)

{
  ulong uVar1;
  long in_RSI;
  long in_RDI;
  Dialog *unaff_retaddr;
  
  if ((*(int *)(in_RSI + 0x40) == 1) &&
     (check_mouse_over(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI),
     *(long *)(in_RDI + 0x48) != 0)) {
    *(undefined8 *)(in_RDI + 0x50) = *(undefined8 *)(in_RDI + 0x48);
    (**(code **)(**(long **)(in_RDI + 0x50) + 0x30))
              (*(long **)(in_RDI + 0x50),*(undefined4 *)(in_RSI + 0x20),
               *(undefined4 *)(in_RSI + 0x24));
    if (*(long *)(in_RDI + 0x50) != *(long *)(in_RDI + 0x58)) {
      if (*(long *)(in_RDI + 0x58) != 0) {
        (**(code **)(**(long **)(in_RDI + 0x58) + 0x60))();
        *(undefined8 *)(in_RDI + 0x58) = 0;
      }
      uVar1 = (**(code **)(**(long **)(in_RDI + 0x50) + 0x50))();
      if ((uVar1 & 1) != 0) {
        *(undefined8 *)(in_RDI + 0x58) = *(undefined8 *)(in_RDI + 0x50);
        (**(code **)(**(long **)(in_RDI + 0x58) + 0x58))();
      }
    }
  }
  return;
}

Assistant:

void Dialog::on_mouse_button_down(const ALLEGRO_MOUSE_EVENT & event)
{
   if (event.button != 1)
      return;

   /* With touch input we may not receive mouse axes event before the touch
    * so we must check which widget the touch is over.
    */
   this->check_mouse_over(event.x, event.y);
   if (!this->mouse_over_widget)
      return;

   this->mouse_down_widget = this->mouse_over_widget;
   this->mouse_down_widget->on_mouse_button_down(event.x, event.y);

   /* transfer key focus */
   if (this->mouse_down_widget != this->key_widget) {
      if (this->key_widget) {
         this->key_widget->lost_key_focus();
         this->key_widget = NULL;
      }
      if (this->mouse_down_widget->want_key_focus()) {
         this->key_widget = this->mouse_down_widget;
         this->key_widget->got_key_focus();
      }
   }
}